

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall soul::heart::Printer::PrinterStream::printStructs(PrinterStream *this)

{
  size_t sVar1;
  RefCountedPtr<soul::Structure> *pRVar2;
  Structure *s;
  long lVar3;
  
  sVar1 = (this->module->structs).structs.numActive;
  if (sVar1 != 0) {
    pRVar2 = (this->module->structs).structs.items;
    lVar3 = 0;
    do {
      s = *(Structure **)((long)&pRVar2->object + lVar3);
      if (s == (Structure *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x46);
      }
      printStruct(this,s);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return;
}

Assistant:

void printStructs()
        {
            for (auto& s : module.structs.get())
                printStruct (*s);
        }